

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4,StringPtr *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10)

{
  long lVar1;
  size_t size;
  char *target;
  long local_88 [3];
  char *local_70;
  undefined8 local_68;
  long local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  local_88[0] = *(long *)(this + 8);
  local_88[1] = params->size_;
  local_88[2] = params_1->size_;
  local_70 = params_2->ptr;
  local_68 = *(undefined8 *)params_3->content;
  local_60 = params_4->size_ - 1;
  local_58 = (params_5->content).size_;
  local_50 = params_6->size_;
  local_48 = params_7->size_;
  local_40 = params_8->size_;
  local_38 = params_9->size_;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_88 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x58);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(ArrayPtr<const_char> *)this,params,params_1,(CappedArray<char,_14UL> *)params_2
             ,(ArrayPtr<const_char> *)params_3,(StringPtr *)params_4,&params_5->content,params_6,
             params_7,params_8,params_9);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}